

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this)

{
  uint16_t uVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *ptr;
  Ch *ptr_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *local_20;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *v;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *e;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  uVar1 = (this->data_).f.flags;
  if (uVar1 == 3) {
    DoFreeMembers(this);
  }
  else if (uVar1 == 4) {
    ptr = GetElementsPointer(this);
    for (local_20 = ptr; local_20 != ptr + (this->data_).s.length; local_20 = local_20 + 1) {
      ~GenericValue(local_20);
    }
    CrtAllocator::Free(ptr);
  }
  else if (uVar1 == 0xc05) {
    ptr_00 = GetStringPointer(this);
    CrtAllocator::Free(ptr_00);
  }
  return;
}

Assistant:

~GenericValue() {
        // With RAPIDJSON_USE_MEMBERSMAP, the maps need to be destroyed to release
        // their Allocator if it's refcounted (e.g. MemoryPoolAllocator).
        if (Allocator::kNeedFree || (RAPIDJSON_USE_MEMBERSMAP+0 &&
                                     internal::IsRefCounted<Allocator>::Value)) {
            switch(data_.f.flags) {
            case kArrayFlag:
                {
                    GenericValue* e = GetElementsPointer();
                    for (GenericValue* v = e; v != e + data_.a.size; ++v)
                        v->~GenericValue();
                    if (Allocator::kNeedFree) { // Shortcut by Allocator's trait
                        Allocator::Free(e);
                    }
                }
                break;

            case kObjectFlag:
                DoFreeMembers();
                break;

            case kCopyStringFlag:
                if (Allocator::kNeedFree) { // Shortcut by Allocator's trait
                    Allocator::Free(const_cast<Ch*>(GetStringPointer()));
                }
                break;

            default:
                break;  // Do nothing for other types.
            }
        }
    }